

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

sector_t * __thiscall
FGLRenderer::RenderViewpoint
          (FGLRenderer *this,AActor *camera,GL_IRECT *bounds,float fov,float ratio,float fovratio,
          bool mainview,bool toscreen)

{
  double *this_00;
  long lVar1;
  double dVar2;
  double dVar3;
  VSMatrix matrix;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  angle_t aVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  float fVar10;
  Stereo3DMode *local_110;
  angle_t a1;
  undefined1 local_f0 [8];
  ScopedViewShifter viewShifter;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  long *local_90;
  EyePose *eye;
  Stereo3DMode *pSStack_80;
  int eye_ix;
  Stereo3DMode *stereo3dMode;
  float viewShift [3];
  float exposure;
  float light;
  double alen;
  double angy;
  double angx;
  double local_40;
  double radPitch;
  sector_t *lviewsector;
  bool toscreen_local;
  float fStack_28;
  bool mainview_local;
  float fovratio_local;
  float ratio_local;
  float fov_local;
  GL_IRECT *bounds_local;
  AActor *camera_local;
  FGLRenderer *this_local;
  
  this->mSceneClearColor[0] = 0.0;
  this->mSceneClearColor[1] = 0.0;
  this->mSceneClearColor[2] = 0.0;
  lviewsector._2_1_ = toscreen;
  lviewsector._3_1_ = mainview;
  lviewsector._4_4_ = fovratio;
  fStack_28 = ratio;
  fovratio_local = fov;
  _ratio_local = bounds;
  bounds_local = (GL_IRECT *)camera;
  camera_local = (AActor *)this;
  R_SetupFrame(camera);
  SetViewArea(this);
  TAngle<double>::Normalized180((TAngle<double> *)&angx);
  local_40 = TAngle<double>::Radians((TAngle<double> *)&angx);
  dVar2 = cos(local_40);
  dVar3 = sin(local_40);
  dVar3 = dVar3 * (double)glset.pixelstretch;
  dVar2 = asin(dVar3 / SQRT(dVar2 * dVar2 + dVar3 * dVar3));
  fVar10 = RAD2DEG((float)dVar2);
  TAngle<float>::operator=(&(this->mAngles).Pitch,(double)fVar10);
  uVar4 = (ulong)ViewRoll.Degrees >> 0x20;
  (this->mAngles).Roll.Degrees = (float)ViewRoll.Degrees;
  dVar2 = std::fmod((double)CONCAT44((int)uVar4,(float)gl_frameMS * ::level.skyspeed1),
                    5.6779965500438e-315);
  this->mSky1Pos = (SUB84(dVar2,0) * 90.0) / 256.0;
  dVar2 = std::fmod((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                     (float)gl_frameMS * ::level.skyspeed2),5.6779965500438e-315);
  this->mSky2Pos = (SUB84(dVar2,0) * 90.0) / 256.0;
  lVar1._0_4_ = bounds_local[0x20].left;
  lVar1._4_4_ = bounds_local[0x20].top;
  if ((((lVar1 == 0) ||
       ((*(long *)(bounds_local + 0x20) + -0xd63460) / 0x2a0 != (long)consoleplayer)) ||
      (((*(uint *)(*(long *)(bounds_local + 0x20) + 0xe8) & 0x20) == 0 &&
       ((bVar5 = FBoolCVar::operator_cast_to_bool(&r_deathcamera), !bVar5 ||
        (0 < bounds_local[0x1c].height)))))) ||
     (bounds_local != (GL_IRECT *)**(long **)(bounds_local + 0x20))) {
    this->mViewActor = (AActor *)bounds_local;
  }
  else {
    this->mViewActor = (AActor *)0x0;
  }
  if ((lviewsector._2_1_ & 1) != 0) {
    fVar10 = FFloatCVar::operator_cast_to_float(&gl_exposure);
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      fVar10 = FFloatCVar::operator_cast_to_float(&gl_exposure);
      this->mCameraExposure = fVar10;
    }
    else {
      viewShift[2] = (float)(int)viewsector->lightlevel / 255.0;
      viewShift[1] = MAX<float>((1.0 - viewShift[2] * viewShift[2]) * 0.9 + 1.0,0.5);
      this->mCameraExposure = this->mCameraExposure * 0.995 + viewShift[1] * 0.005;
    }
  }
  radPitch = (double)viewsector;
  if (((lviewsector._3_1_ & 1) == 0) || ((lviewsector._2_1_ & 1) == 0)) {
    local_110 = s3d::Stereo3DMode::getMonoMode();
  }
  else {
    local_110 = s3d::Stereo3DMode::getCurrentMode();
  }
  pSStack_80 = local_110;
  (*local_110->_vptr_Stereo3DMode[4])();
  for (eye._4_4_ = 0; uVar8 = eye._4_4_, iVar6 = (*pSStack_80->_vptr_Stereo3DMode[2])(),
      (int)uVar8 < iVar6; eye._4_4_ = eye._4_4_ + 1) {
    iVar6 = (*pSStack_80->_vptr_Stereo3DMode[3])(pSStack_80,(ulong)eye._4_4_);
    local_90 = (long *)CONCAT44(extraout_var,iVar6);
    (**(code **)(*local_90 + 0x28))();
    SetOutputViewport(this,_ratio_local);
    Set3DViewport(this,(bool)(lviewsector._3_1_ & 1));
    this->mDrawingScene2D = true;
    this->mCurrentFoV = fovratio_local;
    (**(code **)(*local_90 + 0x10))(fovratio_local,fStack_28,lviewsector._4_4_,&local_d0);
    matrix.mMatrix[2] = (FLOATTYPE)(undefined4)uStack_c8;
    matrix.mMatrix[3] = (FLOATTYPE)uStack_c8._4_4_;
    matrix.mMatrix[0] = (FLOATTYPE)(undefined4)local_d0;
    matrix.mMatrix[1] = (FLOATTYPE)local_d0._4_4_;
    matrix.mMatrix[4] = (FLOATTYPE)(undefined4)local_c0;
    matrix.mMatrix[5] = (FLOATTYPE)local_c0._4_4_;
    matrix.mMatrix[6] = (FLOATTYPE)(undefined4)uStack_b8;
    matrix.mMatrix[7] = (FLOATTYPE)uStack_b8._4_4_;
    matrix.mMatrix[8] = (FLOATTYPE)(undefined4)local_b0;
    matrix.mMatrix[9] = (FLOATTYPE)local_b0._4_4_;
    matrix.mMatrix[10] = (FLOATTYPE)(undefined4)uStack_a8;
    matrix.mMatrix[0xb] = (FLOATTYPE)uStack_a8._4_4_;
    matrix.mMatrix[0xc] = (FLOATTYPE)(undefined4)local_a0;
    matrix.mMatrix[0xd] = (FLOATTYPE)local_a0._4_4_;
    matrix.mMatrix[0xe] = (FLOATTYPE)(undefined4)uStack_98;
    matrix.mMatrix[0xf] = (FLOATTYPE)uStack_98._4_4_;
    SetProjection(this,matrix);
    this_00 = &viewShifter.cachedView.Z;
    TAngle<double>::TAngle((TAngle<double> *)this_00,&ViewAngle);
    SetViewAngle(this,(DAngle *)this_00);
    (**(code **)(*local_90 + 0x20))((GLRenderer->mAngles).Yaw.Degrees);
    s3d::ScopedViewShifter::ScopedViewShifter
              ((ScopedViewShifter *)local_f0,(float *)((long)&stereo3dMode + 4));
    SetViewMatrix(this,(float)ViewPos.X,(float)ViewPos.Y,(float)ViewPos.Z,false,false);
    FRenderState::ApplyMatrices(&gl_RenderState);
    Clipper::Clear(&clipper);
    aVar7 = FrustumAngle(this);
    uVar8 = TAngle<double>::BAMs(&ViewAngle);
    uVar9 = TAngle<double>::BAMs(&ViewAngle);
    Clipper::SafeAddClipRangeRealAngles(&clipper,uVar8 + aVar7,uVar9 - aVar7);
    ProcessScene(this,(bool)(lviewsector._2_1_ & 1));
    if (((lviewsector._3_1_ & 1) != 0) && ((lviewsector._2_1_ & 1) != 0)) {
      EndDrawScene(this,(sector_t *)radPitch);
    }
    if (((lviewsector._3_1_ & 1) != 0) && (bVar5 = FGLRenderBuffers::IsEnabled(), bVar5)) {
      FGLRenderBuffers::BlitSceneToTexture(this->mBuffers);
      BloomScene(this);
      TonemapScene(this);
      ColormapScene(this);
      LensDistortScene(this);
      PostProcessFXAA(this);
      FGLRenderBuffers::BindCurrentFB(this->mBuffers);
      (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                          (this->mScreenViewport).width,(this->mScreenViewport).height);
      DrawBlend(this,(sector_t *)radPitch);
    }
    this->mDrawingScene2D = false;
    uVar8 = (*pSStack_80->_vptr_Stereo3DMode[6])();
    if (((uVar8 & 1) == 0) && (bVar5 = FGLRenderBuffers::IsEnabled(), bVar5)) {
      FGLRenderBuffers::BlitToEyeTexture(this->mBuffers,eye._4_4_);
    }
    (**(code **)(*local_90 + 0x30))();
    s3d::ScopedViewShifter::~ScopedViewShifter((ScopedViewShifter *)local_f0);
  }
  (*pSStack_80->_vptr_Stereo3DMode[5])();
  gl_frameCount = gl_frameCount + 1;
  FInterpolator::RestoreInterpolations(&interpolator);
  return (sector_t *)radPitch;
}

Assistant:

sector_t * FGLRenderer::RenderViewpoint (AActor * camera, GL_IRECT * bounds, float fov, float ratio, float fovratio, bool mainview, bool toscreen)
{       
	sector_t * lviewsector;
	mSceneClearColor[0] = 0.0f;
	mSceneClearColor[1] = 0.0f;
	mSceneClearColor[2] = 0.0f;
	R_SetupFrame (camera);
	SetViewArea();

	// We have to scale the pitch to account for the pixel stretching, because the playsim doesn't know about this and treats it as 1:1.
	double radPitch = ViewPitch.Normalized180().Radians();
	double angx = cos(radPitch);
	double angy = sin(radPitch) * glset.pixelstretch;
	double alen = sqrt(angx*angx + angy*angy);

	mAngles.Pitch = (float)RAD2DEG(asin(angy / alen));
	mAngles.Roll.Degrees = ViewRoll.Degrees;

	// Scroll the sky
	mSky1Pos = (float)fmod(gl_frameMS * level.skyspeed1, 1024.f) * 90.f/256.f;
	mSky2Pos = (float)fmod(gl_frameMS * level.skyspeed2, 1024.f) * 90.f/256.f;



	if (camera->player && camera->player-players==consoleplayer &&
		((camera->player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)) && camera==camera->player->mo)
	{
		mViewActor=NULL;
	}
	else
	{
		mViewActor=camera;
	}

	if (toscreen)
	{
		if (gl_exposure == 0.0f)
		{
			float light = viewsector->lightlevel / 255.0f;
			float exposure = MAX(1.0f + (1.0f - light * light) * 0.9f, 0.5f);
			mCameraExposure = mCameraExposure * 0.995f + exposure * 0.005f;
		}
		else
		{
			mCameraExposure = gl_exposure;
		}
	}

	// 'viewsector' will not survive the rendering so it cannot be used anymore below.
	lviewsector = viewsector;

	// Render (potentially) multiple views for stereo 3d
	float viewShift[3];
	const s3d::Stereo3DMode& stereo3dMode = mainview && toscreen? s3d::Stereo3DMode::getCurrentMode() : s3d::Stereo3DMode::getMonoMode();
	stereo3dMode.SetUp();
	for (int eye_ix = 0; eye_ix < stereo3dMode.eye_count(); ++eye_ix)
	{
		const s3d::EyePose * eye = stereo3dMode.getEyePose(eye_ix);
		eye->SetUp();
		// TODO: stereo specific viewport - needed when implementing side-by-side modes etc.
		SetOutputViewport(bounds);
		Set3DViewport(mainview);
		mDrawingScene2D = true;
		mCurrentFoV = fov;
		// Stereo mode specific perspective projection
		SetProjection( eye->GetProjection(fov, ratio, fovratio) );
		// SetProjection(fov, ratio, fovratio);	// switch to perspective mode and set up clipper
		SetViewAngle(ViewAngle);
		// Stereo mode specific viewpoint adjustment - temporarily shifts global ViewPos
		eye->GetViewShift(GLRenderer->mAngles.Yaw.Degrees, viewShift);
		s3d::ScopedViewShifter viewShifter(viewShift);
		SetViewMatrix(ViewPos.X, ViewPos.Y, ViewPos.Z, false, false);
		gl_RenderState.ApplyMatrices();

		clipper.Clear();
		angle_t a1 = FrustumAngle();
		clipper.SafeAddClipRangeRealAngles(ViewAngle.BAMs() + a1, ViewAngle.BAMs() - a1);

		ProcessScene(toscreen);
		if (mainview && toscreen) EndDrawScene(lviewsector);	// do not call this for camera textures.
		if (mainview && FGLRenderBuffers::IsEnabled())
		{
			mBuffers->BlitSceneToTexture();
			BloomScene();
			TonemapScene();
			ColormapScene();
			LensDistortScene();
			PostProcessFXAA();

			// This should be done after postprocessing, not before.
			mBuffers->BindCurrentFB();
			glViewport(mScreenViewport.left, mScreenViewport.top, mScreenViewport.width, mScreenViewport.height);
			DrawBlend(lviewsector);
		}
		mDrawingScene2D = false;
		if (!stereo3dMode.IsMono() && FGLRenderBuffers::IsEnabled())
			mBuffers->BlitToEyeTexture(eye_ix);
		eye->TearDown();
	}
	stereo3dMode.TearDown();

	gl_frameCount++;	// This counter must be increased right before the interpolations are restored.
	interpolator.RestoreInterpolations ();
	return lviewsector;
}